

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O2

string * read_file(string *__return_storage_ptr__,string *path)

{
  long *plVar1;
  string buf;
  ifstream stream;
  
  std::ifstream::ifstream(&stream,(string *)path,_S_in);
  std::ios::exceptions((int)&stream + (int)*(undefined8 *)(_stream + -0x18));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  buf._M_dataplus._M_p = (pointer)&buf.field_2;
  std::__cxx11::string::_M_construct((ulong)&buf,'\0');
  while( true ) {
    plVar1 = (long *)std::istream::read((char *)&stream,(long)buf._M_dataplus._M_p);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)&buf,0);
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__,(ulong)&buf,0);
  std::__cxx11::string::~string((string *)&buf);
  std::ifstream::~ifstream(&stream);
  return __return_storage_ptr__;
}

Assistant:

auto read_file(std::string& path) -> std::string {
    constexpr auto read_size = std::size_t{4096};
    auto stream = std::ifstream{path};
    stream.exceptions(std::ios_base::badbit);

    auto out = std::string{};
    auto buf = std::string(read_size, '\0');
    while (stream.read(& buf[0], read_size)) {
        out.append(buf, 0, stream.gcount());
    }
    out.append(buf, 0, stream.gcount());
    return out;
}